

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveCardsOperationSnapshotCreator.cpp
# Opt level: O2

unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
 __thiscall
solitaire::archivers::MoveCardsOperationSnapshotCreator::createSnapshotIfCardsMovedToOtherPile
          (MoveCardsOperationSnapshotCreator *this,
          unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
          *destinationPileSnapshot)

{
  Snapshot *pSVar1;
  int iVar2;
  Snapshot *in_RAX;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  *in_RDX;
  MoveCardsOperationSnapshotCreator *this_00;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  *__args_1;
  _Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false> local_28;
  
  this_00 = (MoveCardsOperationSnapshotCreator *)destinationPileSnapshot;
  local_28._M_head_impl = in_RAX;
  throwIfSourcePileSnapshotIsNullptr((MoveCardsOperationSnapshotCreator *)destinationPileSnapshot);
  throwIfSnapshotIsNullptr(this_00,in_RDX);
  pSVar1 = destinationPileSnapshot[1]._M_t.
           super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
           .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl;
  __args_1 = destinationPileSnapshot + 1;
  iVar2 = (*pSVar1->_vptr_Snapshot[3])
                    (pSVar1,(in_RDX->_M_t).
                            super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
                            .
                            super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>
                            ._M_head_impl);
  if ((char)iVar2 == '\0') {
    std::
    make_unique<solitaire::archivers::MoveCardsOperationSnapshotCreator::Snapshot,std::unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>,std::unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>>
              ((unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
                *)&local_28,__args_1);
    (this->super_MoveCardsOperationSnapshotCreator)._vptr_MoveCardsOperationSnapshotCreator =
         (_func_int **)local_28._M_head_impl;
  }
  else {
    pSVar1 = (__args_1->_M_t).
             super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
             .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>.
             _M_head_impl;
    (__args_1->_M_t).
    super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl =
         (Snapshot *)0x0;
    if (pSVar1 != (Snapshot *)0x0) {
      (*pSVar1->_vptr_Snapshot[1])();
    }
    (this->super_MoveCardsOperationSnapshotCreator)._vptr_MoveCardsOperationSnapshotCreator =
         (_func_int **)0x0;
  }
  return (__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
          )(__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<interfaces::Snapshot>
MoveCardsOperationSnapshotCreator::createSnapshotIfCardsMovedToOtherPile(
    std::unique_ptr<interfaces::Snapshot> destinationPileSnapshot)
{
    throwIfSourcePileSnapshotIsNullptr();
    throwIfSnapshotIsNullptr(destinationPileSnapshot);

    if (sourcePileSnapshot->isSnapshotOfSameObject(*destinationPileSnapshot))
    {
        sourcePileSnapshot = nullptr;
        return nullptr;
    }

    return std::make_unique<Snapshot>(
        std::move(sourcePileSnapshot), std::move(destinationPileSnapshot)
    );
}